

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::desaturate<unsigned_char>(image *this,ConstPtr *img,DesaturateType type)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int height;
  ImageBase *pIVar4;
  invalid_argument *piVar5;
  TypedImageBase<unsigned_char> *pTVar6;
  element_type *peVar7;
  uchar *puVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  Ptr PVar11;
  uchar *v;
  int i;
  int pixels;
  int inpos;
  int outpos;
  DesaturateFunc func;
  bool has_alpha;
  int ic;
  DesaturateType type_local;
  ConstPtr *img_local;
  Ptr *out;
  
  bVar1 = std::operator==(img,(nullptr_t)0x0);
  if (bVar1) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Null image given");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)img);
  iVar3 = ImageBase::channels(pIVar4);
  if ((iVar3 != 3) && (iVar3 != 4)) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Image must be RGB or RGBA");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = iVar3 == 4;
  Image<unsigned_char>::create();
  pTVar6 = &std::
            __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this)->super_TypedImageBase<unsigned_char>;
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)img);
  iVar3 = ImageBase::width(pIVar4);
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)img);
  height = ImageBase::height(pIVar4);
  TypedImageBase<unsigned_char>::allocate(pTVar6,iVar3,height,bVar1 + 1);
  switch(type) {
  case DESATURATE_MAXIMUM:
    _inpos = desaturate_maximum<unsigned_char>;
    break;
  case DESATURATE_LIGHTNESS:
    _inpos = desaturate_lightness<unsigned_char>;
    break;
  case DESATURATE_LUMINOSITY:
    _inpos = desaturate_luminosity<unsigned_char>;
    break;
  case DESATURATE_LUMINANCE:
    _inpos = desaturate_luminance<unsigned_char>;
    break;
  case DESATURATE_AVERAGE:
    _inpos = desaturate_average<unsigned_char>;
    break;
  default:
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid desaturate type");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pixels = 0;
  i = 0;
  pTVar6 = &std::
            __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)img)->super_TypedImageBase<unsigned_char>;
  iVar3 = TypedImageBase<unsigned_char>::get_pixel_amount(pTVar6);
  _Var10._M_pi = extraout_RDX;
  for (v._0_4_ = 0; (int)v < iVar3; v._0_4_ = (int)v + 1) {
    peVar7 = std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)img);
    puVar8 = Image<unsigned_char>::at(peVar7,i);
    uVar2 = (*_inpos)(puVar8);
    peVar9 = std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    puVar8 = Image<unsigned_char>::at(peVar9,pixels);
    *puVar8 = uVar2;
    _Var10._M_pi = extraout_RDX_00;
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      puVar8 = Image<unsigned_char>::at(peVar7,i + 3);
      uVar2 = *puVar8;
      peVar9 = std::
               __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      puVar8 = Image<unsigned_char>::at(peVar9,pixels + 1);
      *puVar8 = uVar2;
      _Var10._M_pi = extraout_RDX_01;
    }
    pixels = bVar1 + 1 + pixels;
    i = bVar1 + 3 + i;
  }
  PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var10._M_pi;
  PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar11.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
desaturate (typename Image<T>::ConstPtr img, DesaturateType type)
{
    if (img == nullptr)
        throw std::invalid_argument("Null image given");

    int ic = img->channels();
    if (ic != 3 && ic != 4)
        throw std::invalid_argument("Image must be RGB or RGBA");

    bool has_alpha = (ic == 4);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(img->width(), img->height(), 1 + has_alpha);

    typedef T(*DesaturateFunc)(T const*);
    DesaturateFunc func;
    switch (type)
    {
        case DESATURATE_MAXIMUM: func = desaturate_maximum<T>; break;
        case DESATURATE_LIGHTNESS: func = desaturate_lightness<T>; break;
        case DESATURATE_LUMINOSITY: func = desaturate_luminosity<T>; break;
        case DESATURATE_LUMINANCE: func = desaturate_luminance<T>; break;
        case DESATURATE_AVERAGE: func = desaturate_average<T>; break;
        default: throw std::invalid_argument("Invalid desaturate type");
    }

    int outpos = 0;
    int inpos = 0;
    int pixels = img->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        T const* v = &img->at(inpos);
        out->at(outpos) = func(v);

        if (has_alpha)
            out->at(outpos + 1) = img->at(inpos + 3);

        outpos += 1 + has_alpha;
        inpos += 3 + has_alpha;
    }

    return out;
}